

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

void __thiscall miniscript::Node<CPubKey>::~Node(Node<CPubKey> *this)

{
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  *this_00;
  pointer psVar1;
  element_type *peVar2;
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  *this_01;
  long in_FS_OFFSET;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->subs;
  while (psVar1 = (this->subs).
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (this->subs).
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar1) {
    peVar2 = psVar1[-1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    a_Stack_30[0]._M_pi =
         psVar1[-1].super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    psVar1[-1].super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar1[-1].super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    this_01 = this_00;
    while( true ) {
      std::
      vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
      ::pop_back(this_01);
      psVar1 = (peVar2->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((peVar2->subs).
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == psVar1) break;
      std::
      vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
      ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                  *)this_00,psVar1 + -1);
      this_01 = &peVar2->subs;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  }
  std::
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ::~vector(this_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Node() {
        while (!subs.empty()) {
            auto node = std::move(subs.back());
            subs.pop_back();
            while (!node->subs.empty()) {
                subs.push_back(std::move(node->subs.back()));
                node->subs.pop_back();
            }
        }
    }